

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Ignore_TestShell::createTest
          (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TeamCityOutputTest.cpp"
                                  ,0xcb);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  this_00[5]._vptr_Utest = (_func_int **)0x0;
  this_00[6]._vptr_Utest = (_func_int **)0x0;
  this_00[7]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_003531d8;
  return this_00;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Ignore)
{
	IgnoredUtestShell itst("group", "'[]\n\r", "file", 10);
	result->currentTestStarted(&itst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testIgnored name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}